

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_bench.cc
# Opt level: O1

void renumber<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,std::mutex>,phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,phmap::NullMutex>>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *vertex_ids,
               vector<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
               *elements,int num_threads)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  atomic<unsigned_long> new_id;
  threadpool pool;
  parallel_flat_hash_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_4UL,_phmap::NullMutex>
  new_ids_nc;
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  new_ids;
  undefined1 local_8e8 [16];
  vector<std::thread,_std::allocator<std::thread>_> local_8d8;
  undefined1 local_8c0 [16];
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  local_8b0;
  slot_type local_5b0 [88];
  
  lVar1 = 0x50;
  do {
    *(undefined8 *)((long)local_5b0 + lVar1 + -0x40) = 0;
    *(undefined8 *)((long)local_5b0 + lVar1 + -0x38) = 0;
    *(undefined8 *)((long)local_5b0 + lVar1 + -0x50) = 0;
    *(undefined8 *)((long)local_5b0 + lVar1 + -0x48) = 0;
    *(undefined8 *)((long)local_5b0 + lVar1 + -0x30) = 0;
    *(undefined1 **)((long)local_5b0 + lVar1 + -0x28) =
         phmap::priv::
         EmptyGroup<std::is_same<std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>()
         ::empty_group;
    *(undefined8 *)((long)local_5b0 + lVar1) = 0;
    *(undefined8 *)((long)local_5b0 + lVar1 + -0x20) = 0;
    *(undefined8 *)((long)local_5b0 + lVar1 + -0x18) = 0;
    *(undefined8 *)((long)local_5b0 + lVar1 + -0x10) = 0;
    lVar1 = lVar1 + 0x58;
  } while (lVar1 != 0x5d0);
  local_8e8._0_8_ = 0;
  local_8d8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_8d8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8d8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_8e8._8_4_ = num_threads;
  lVar2 = std::chrono::_V2::system_clock::now();
  uVar5 = ((long)(vertex_ids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(vertex_ids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3) * 0x6e;
  uVar3 = uVar5 >> 2;
  uVar6 = uVar3 / 0x19;
  uVar6 = (long)(uVar6 - 1) / 7 + uVar6;
  uVar3 = uVar3 / 400;
  lVar1 = 0x3f;
  if (uVar3 != 0) {
    for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  uVar3 = 0x10;
  if (0x63f < uVar5) {
    uVar3 = (0xffffffffffffffffU >> (~(byte)lVar1 & 0x3f)) << 4;
  }
  if (uVar3 <= uVar6) {
    uVar3 = uVar6;
  }
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::rehash((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            *)&local_5b0[0].value,uVar3);
  local_8b0.sets_._M_elems[0].set_.ctrl_ = local_8e8;
  local_8b0.sets_._M_elems[0].set_.slots_ = local_5b0;
  local_8b0.sets_._M_elems[0].set_.size_ = (size_t)vertex_ids;
  threadpool::
  parallel_for<renumber<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,std::mutex>,phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,phmap::NullMutex>>(std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<std::array<unsigned_long,4ul>,std::allocator<std::array<unsigned_long,4ul>>>,int)::_lambda(unsigned_long)_1_>
            ((threadpool *)(local_8e8 + 8),
             (long)(vertex_ids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(vertex_ids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3,
             (anon_class_24_3_a8da36f3 *)&local_8b0);
  lVar1 = std::chrono::_V2::system_clock::now();
  poVar4 = std::ostream::_M_insert<double>(((double)(lVar1 - lVar2) / 1000000000.0) * 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ms ",3);
  local_8e8._8_4_ = num_threads;
  lVar1 = std::chrono::_V2::system_clock::now();
  lVar2 = 0;
  do {
    *(undefined1 **)((long)&local_8b0.sets_._M_elems[0].set_.ctrl_ + lVar2) =
         phmap::priv::
         EmptyGroup<std::is_same<std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>()
         ::empty_group;
    *(undefined8 *)
     ((long)&local_8b0.sets_._M_elems[0].set_.settings_.
             super__Tuple_impl<0UL,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
     + lVar2) = 0;
    *(undefined8 *)((long)&local_8b0.sets_._M_elems[0].set_.slots_ + lVar2) = 0;
    *(undefined8 *)((long)&local_8b0.sets_._M_elems[0].set_.size_ + lVar2) = 0;
    *(undefined8 *)((long)&local_8b0.sets_._M_elems[0].set_.capacity_ + lVar2) = 0;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x300);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::swap<std::mutex>(&local_8b0,
                     (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
                      *)&local_5b0[0].value);
  local_8c0._0_8_ = elements;
  local_8c0._8_8_ = (anon_class_24_3_a8da36f3 *)&local_8b0;
  threadpool::
  parallel_for<renumber<phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,std::mutex>,phmap::parallel_flat_hash_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,4ul,phmap::NullMutex>>(std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<std::array<unsigned_long,4ul>,std::allocator<std::array<unsigned_long,4ul>>>,int)::_lambda(unsigned_long)_2_>
            ((threadpool *)(local_8e8 + 8),
             (long)(elements->
                   super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(elements->
                   super__Vector_base<std::array<unsigned_long,_4UL>,_std::allocator<std::array<unsigned_long,_4UL>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,
             (anon_class_24_3_a8da36f3 *)local_8c0);
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar4 = std::ostream::_M_insert<double>(((double)(lVar2 - lVar1) / 1000000000.0) * 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ms",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~parallel_hash_set(&local_8b0);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_8d8);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~parallel_hash_set
            ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              *)&local_5b0[0].value);
  return;
}

Assistant:

void renumber(const std::vector< uint64_t > & vertex_ids, 
              std::vector< std::array< uint64_t, 4 > > elements,
              int num_threads) {
    bool supports_parallel_insertion = 
        !std::is_same< Map, std::unordered_map<uint64_t, uint64_t> >::value;

    Map new_ids;
    std::atomic< uint64_t > new_id{ 0 };

    timer stopwatch;
    threadpool pool((supports_parallel_insertion) ? num_threads : 1);

    stopwatch.start();
    new_ids.reserve(vertex_ids.size() * 110 / 100);
    pool.parallel_for(vertex_ids.size(), [&](uint64_t i){
        auto id = new_id++;
        new_ids[vertex_ids[i]] = id;
    });
    stopwatch.stop();
    std::cout << stopwatch.elapsed() * 1000 << "ms ";

    pool.num_threads = num_threads;
    stopwatch.start();
    Map_nomutex new_ids_nc;
    new_ids_nc.swap(new_ids);
    pool.parallel_for(elements.size(), [&](uint64_t i) {
        auto & elem = elements[i];
        elem = {  new_ids_nc.at(elem[0]),
                  new_ids_nc.at(elem[1]),
                  new_ids_nc.at(elem[2]),
                  new_ids_nc.at(elem[3]) };
    });
    stopwatch.stop();
    std::cout << stopwatch.elapsed() * 1000 << "ms" << std::endl;
}